

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
(anonymous_namespace)::ClangShellCommand::processDiscoveredDependencies(llbuild::core::
TaskInterface,llbuild::basic::QueueJobContext*)::DepsActions::error(llvm::StringRef_unsigned_long_
          (void *this,StringRef message,uint64_t position)

{
  _func_int *p_Var1;
  long lVar2;
  BuildEngineDelegate *pBVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  char *pcVar7;
  ulong uVar8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  TaskInterface local_70;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar7 = message.Data;
  local_70.impl = *(void **)((long)this + 8);
  local_70.ctx = *(void **)((long)this + 0x10);
  pBVar3 = llbuild::core::TaskInterface::delegate(&local_70);
  p_Var1 = pBVar3[1]._vptr_BuildEngineDelegate[1];
  lVar2 = *(long *)((long)this + 0x18);
  std::operator+(&local_50,"error reading dependency file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (lVar2 + 0x150));
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = &local_a0;
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_a0 = *puVar6;
    uStack_98 = (undefined4)plVar4[3];
    uStack_94 = *(undefined4 *)((long)plVar4 + 0x1c);
  }
  else {
    local_a0 = *puVar6;
    local_b0 = (ulong *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_90 = &local_80;
  if (pcVar7 == (char *)0x0) {
    local_88 = 0;
    local_80 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,pcVar7,pcVar7 + message.Length);
  }
  uVar8 = 0xf;
  if (local_b0 != &local_a0) {
    uVar8 = local_a0;
  }
  if (uVar8 < (ulong)(local_88 + local_a8)) {
    uVar8 = 0xf;
    if (local_90 != &local_80) {
      uVar8 = CONCAT71(uStack_7f,local_80);
    }
    if ((ulong)(local_88 + local_a8) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_b0);
      goto LAB_00140135;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_90);
LAB_00140135:
  local_70.impl = &local_60;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_60 = *plVar4;
    uStack_58 = *(undefined4 *)(puVar5 + 3);
    uStack_54 = *(undefined4 *)((long)puVar5 + 0x1c);
  }
  else {
    local_60 = *plVar4;
    local_70.impl = (long *)*puVar5;
  }
  local_70.ctx = (void *)puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  (**(code **)(*(long *)p_Var1 + 0x58))(p_Var1,lVar2,local_70.impl,local_70.ctx);
  if ((long *)local_70.impl != &local_60) {
    operator_delete(local_70.impl,local_60 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(int *)((long)this + 0x20) = *(int *)((long)this + 0x20) + 1;
  return;
}

Assistant:

virtual void error(StringRef message, uint64_t position) override {
        getBuildSystem(ti).getDelegate().commandHadError(command,
                       "error reading dependency file '" + command->depsPath +
                       "': " + message.str());
        ++numErrors;
      }